

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

int __thiscall Bstrlib::String::reverseFind(String *this,char c,int pos)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = (this->super_tagbstring).slen;
  iVar3 = iVar1 + -1;
  if (-1 < pos) {
    iVar3 = pos;
  }
  if ((iVar3 <= iVar1) && (uVar4 = iVar3 - (uint)(iVar3 == iVar1), -1 < (int)uVar4)) {
    do {
      if ((this->super_tagbstring).data[uVar4] == c) {
        return uVar4;
      }
      bVar2 = 0 < (int)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
  }
  return -1;
}

Assistant:

int String::reverseFind(char c, int pos) const
    {
        if (pos < 0) pos = slen-1;
        if (pos > slen)            return BSTR_ERR;
        if (pos == slen)        pos--;
        for (; pos >= 0; pos--)
        {
            if (data[pos] ==(unsigned char) c)    return pos;
        }
        return BSTR_ERR;
    }